

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_glob.c
# Opt level: O0

void max_default(t_pd *x,t_symbol *s,int argc,t_atom *argv)

{
  char *pcVar1;
  char local_88 [8];
  char str [80];
  int local_2c;
  int i;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_pd *x_local;
  
  pcVar1 = class_getname(*x);
  startpost("%s: unknown message %s ",pcVar1,s->s_name);
  for (local_2c = 0; local_2c < argc; local_2c = local_2c + 1) {
    atom_string(argv + local_2c,local_88,0x50);
    poststring(local_88);
  }
  endpost();
  return;
}

Assistant:

void max_default(t_pd *x, t_symbol *s, int argc, t_atom *argv)
{
    int i;
    char str[80];
    startpost("%s: unknown message %s ", class_getname(pd_class(x)),
        s->s_name);
    for (i = 0; i < argc; i++)
    {
        atom_string(argv+i, str, 80);
        poststring(str);
    }
    endpost();
}